

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O3

bool __thiscall
sptk::StatisticsAccumulation::GetSum
          (StatisticsAccumulation *this,Buffer *buffer,vector<double,_std::allocator<double>_> *sum)

{
  int iVar1;
  double *pdVar2;
  pointer pdVar3;
  bool bVar4;
  size_type __new_size;
  double *__src;
  
  if (this->is_valid_ == true) {
    bVar4 = false;
    if ((sum != (vector<double,_std::allocator<double>_> *)0x0) &&
       (bVar4 = false, 0 < this->num_statistics_order_)) {
      __new_size = (long)this->num_order_ + 1;
      if ((long)(sum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(sum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(sum,__new_size);
      }
      __src = (buffer->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
      pdVar2 = (buffer->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this->numerically_stable_ == true) {
        bVar4 = true;
        if (__src != pdVar2) {
          pdVar3 = (sum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar1 = buffer->zeroth_order_statistics_;
          do {
            *pdVar3 = *__src * (double)iVar1;
            __src = __src + 1;
            pdVar3 = pdVar3 + 1;
          } while (__src != pdVar2);
        }
      }
      else {
        bVar4 = true;
        if ((long)pdVar2 - (long)__src != 0) {
          memmove((sum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,__src,(long)pdVar2 - (long)__src);
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool StatisticsAccumulation::GetSum(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* sum) const {
  if (!is_valid_ || num_statistics_order_ < 1 || NULL == sum) {
    return false;
  }

  if (sum->size() != static_cast<std::size_t>(num_order_ + 1)) {
    sum->resize(num_order_ + 1);
  }

  if (numerically_stable_) {
    const int n(buffer.zeroth_order_statistics_);
    std::transform(buffer.first_order_statistics_.begin(),
                   buffer.first_order_statistics_.end(), sum->begin(),
                   [n](double x) { return n * x; });
  } else {
    std::copy(buffer.first_order_statistics_.begin(),
              buffer.first_order_statistics_.end(), sum->begin());
  }

  return true;
}